

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kaitaistream.cpp
# Opt level: O2

string * kaitai::kstream::process_xor_many(string *__return_storage_ptr__,string *data,string *key)

{
  size_type sVar1;
  ulong uVar2;
  ulong uVar3;
  size_type sVar4;
  
  sVar1 = data->_M_string_length;
  uVar2 = key->_M_string_length;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,(char)sVar1);
  uVar3 = 0;
  for (sVar4 = 0; sVar1 != sVar4; sVar4 = sVar4 + 1) {
    (__return_storage_ptr__->_M_dataplus)._M_p[sVar4] =
         (key->_M_dataplus)._M_p[uVar3] ^ (data->_M_dataplus)._M_p[sVar4];
    uVar3 = uVar3 + 1;
    if (uVar2 <= uVar3) {
      uVar3 = 0;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string kaitai::kstream::process_xor_many(std::string data, std::string key) {
    size_t len = data.length();
    size_t kl = key.length();
    std::string result(len, ' ');

    size_t ki = 0;
    for (size_t i = 0; i < len; i++) {
        result[i] = data[i] ^ key[ki];
        ki++;
        if (ki >= kl)
            ki = 0;
    }

    return result;
}